

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignEvaluator.h
# Opt level: O2

void Eigen::internal::
     call_dense_assignment_loop<Eigen::Block<Eigen::Matrix<double,_1,3,1,_1,3>,1,3,true>,Eigen::Matrix<double,1,3,1,1,3>,Eigen::internal::assign_op<double,double>>
               (Block<Eigen::Matrix<double,__1,_3,_1,__1,_3>,_1,_3,_true> *dst,
               Matrix<double,_1,_3,_1,_1,_3> *src,assign_op<double,_double> *func)

{
  DstEvaluatorType dstEvaluator;
  SrcEvaluatorType srcEvaluator;
  Kernel kernel;
  mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,_3,_1,__1,_3>,_1,_3,_true>,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>
  local_60;
  SrcEvaluatorType local_50;
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,__1,_3,_1,__1,_3>,_1,_3,_true>_>,_Eigen::internal::evaluator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_Eigen::internal::assign_op<double,_double>,_0>
  local_40;
  
  local_50.super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>.m_data =
       (Scalar *)src;
  mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,_-1,_3,_1,_-1,_3>,_1,_3,_true>,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>
  ::mapbase_evaluator(&local_60,dst);
  local_40.m_dst = (DstEvaluatorType *)&local_60;
  local_40.m_src = &local_50;
  local_40.m_functor = func;
  local_40.m_dstExpr = dst;
  dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_-1,_3,_1,_-1,_3>,_1,_3,_true>_>,_Eigen::internal::evaluator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_Eigen::internal::assign_op<double,_double>,_0>,_3,_2>
  ::run(&local_40);
  return;
}

Assistant:

EIGEN_DEVICE_FUNC EIGEN_STRONG_INLINE void call_dense_assignment_loop(DstXprType& dst, const SrcXprType& src, const Functor &func)
{
  typedef evaluator<DstXprType> DstEvaluatorType;
  typedef evaluator<SrcXprType> SrcEvaluatorType;

  SrcEvaluatorType srcEvaluator(src);

  // NOTE To properly handle A = (A*A.transpose())/s with A rectangular,
  // we need to resize the destination after the source evaluator has been created.
  resize_if_allowed(dst, src, func);

  DstEvaluatorType dstEvaluator(dst);
    
  typedef generic_dense_assignment_kernel<DstEvaluatorType,SrcEvaluatorType,Functor> Kernel;
  Kernel kernel(dstEvaluator, srcEvaluator, func, dst.const_cast_derived());

  dense_assignment_loop<Kernel>::run(kernel);
}